

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O3

void leveldb::SaveValue(void *arg,Slice *ikey,Slice *v)

{
  ulong uVar1;
  int iVar2;
  long in_FS_OFFSET;
  char *local_38;
  long local_30;
  ulong local_28;
  uint local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = ikey->size_;
  if (7 < uVar1) {
    local_38 = ikey->data_;
    local_20 = (uint)*(ulong *)(local_38 + (uVar1 - 8)) & 0xff;
    local_28 = *(ulong *)(local_38 + (uVar1 - 8)) >> 8;
    local_30 = uVar1 - 8;
    if (local_20 < 2) {
      iVar2 = (**(code **)(**(long **)((long)arg + 8) + 0x10))
                        (*(long **)((long)arg + 8),&local_38,(long)arg + 0x10);
      if ((iVar2 == 0) && (*(uint *)arg = (local_20 != 1) + 1, local_20 == 1)) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                  (*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                    ((long)arg + 0x20),0,
                   (*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                     ((long)arg + 0x20))->_M_string_length,v->data_,v->size_);
      }
      goto LAB_0064b3ca;
    }
  }
  *(undefined4 *)arg = 3;
LAB_0064b3ca:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void SaveValue(void* arg, const Slice& ikey, const Slice& v) {
  Saver* s = reinterpret_cast<Saver*>(arg);
  ParsedInternalKey parsed_key;
  if (!ParseInternalKey(ikey, &parsed_key)) {
    s->state = kCorrupt;
  } else {
    if (s->ucmp->Compare(parsed_key.user_key, s->user_key) == 0) {
      s->state = (parsed_key.type == kTypeValue) ? kFound : kDeleted;
      if (s->state == kFound) {
        s->value->assign(v.data(), v.size());
      }
    }
  }
}